

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

void dump_buffer_e(huff_entropy_ptr entropy)

{
  undefined8 *puVar1;
  int iVar2;
  long in_RDI;
  jpeg_destination_mgr *dest;
  
  puVar1 = *(undefined8 **)(*(long *)(in_RDI + 0xd8) + 0x28);
  iVar2 = (*(code *)puVar1[3])(*(undefined8 *)(in_RDI + 0xd8));
  if (iVar2 == 0) {
    *(undefined4 *)(**(long **)(in_RDI + 0xd8) + 0x28) = 0x19;
    (**(code **)**(undefined8 **)(in_RDI + 0xd8))(*(undefined8 *)(in_RDI + 0xd8));
  }
  *(undefined8 *)(in_RDI + 200) = *puVar1;
  *(undefined8 *)(in_RDI + 0xd0) = puVar1[1];
  return;
}

Assistant:

LOCAL(void)
dump_buffer_e (huff_entropy_ptr entropy)
/* Empty the output buffer; we do not support suspension in this case. */
{
  struct jpeg_destination_mgr * dest = entropy->cinfo->dest;

  if (! (*dest->empty_output_buffer) (entropy->cinfo))
    ERREXIT(entropy->cinfo, JERR_CANT_SUSPEND);
  /* After a successful buffer dump, must reset buffer pointers */
  entropy->next_output_byte = dest->next_output_byte;
  entropy->free_in_buffer = dest->free_in_buffer;
}